

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O2

Ivy_Obj_t * Ivy_HaigObjRepr(Ivy_Obj_t *pObj)

{
  Ivy_Obj_t *pIVar1;
  uint __line;
  Ivy_Obj_t *pIVar2;
  char *__assertion;
  
  if (((ulong)pObj & 1) != 0) {
    __assertion = "!Ivy_IsComplement(pObj)";
    __line = 0x31;
LAB_006483db:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyHaig.c"
                  ,__line,"Ivy_Obj_t *Ivy_HaigObjRepr(Ivy_Obj_t *)");
  }
  pIVar1 = pObj->pEquiv;
  if ((pIVar1 != (Ivy_Obj_t *)0x0) && (pIVar2 = pIVar1, pObj->nRefs < 1)) {
    while( true ) {
      pIVar2 = (Ivy_Obj_t *)((ulong)pIVar2 & 0xfffffffffffffffe);
      if (pIVar2 == pObj) break;
      if (0 < pIVar2->nRefs) goto LAB_006483b6;
      pIVar2 = pIVar2->pEquiv;
    }
    if (pIVar2->nRefs < 1) {
      __assertion = "Ivy_ObjRefs(pTemp) > 0";
      __line = 0x3b;
      goto LAB_006483db;
    }
LAB_006483b6:
    pObj = (Ivy_Obj_t *)((ulong)pIVar2 | (ulong)((uint)pIVar1 & 1));
  }
  return pObj;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

/* 
    HAIGing rules in working AIG:
    - Each node in the working AIG has a pointer to the corresponding node in HAIG 
      (this node is not necessarily the representative of the equivalence class of HAIG nodes)
    - This pointer is complemented if the AIG node and its corresponding HAIG node have different phase

    Choice node rules in HAIG:
    - Equivalent nodes are linked into a ring
    - Exactly one node in the ring has fanouts (this node is called the representative)
    - The pointer going from a node to the next node in the ring is complemented 
      if the first node is complemented, compared to the representative node of the equivalence class
    - (consequence of the above) The representative node always has non-complemented pointer to the next node
    - New nodes are inserted into the ring immediately after the representative node
*/

// returns the representative node of the given HAIG node
static inline Ivy_Obj_t * Ivy_HaigObjRepr( Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pTemp;
    assert( !Ivy_IsComplement(pObj) );
    // if the node has no equivalent node or has fanout, it is representative
    if ( pObj->pEquiv == NULL || Ivy_ObjRefs(pObj) > 0 )
        return pObj;
    // the node belongs to a class and is not a representative
    // complemented edge (pObj->pEquiv) tells if it is complemented w.r.t. the repr
    for ( pTemp = Ivy_Regular(pObj->pEquiv); pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
        if ( Ivy_ObjRefs(pTemp) > 0 )
            break;
    // return the representative node
    assert( Ivy_ObjRefs(pTemp) > 0 );
    return Ivy_NotCond( pTemp, Ivy_IsComplement(pObj->pEquiv) );
}